

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O1

void __thiscall
leveldb::AddBoundaryInputsTest_TestOneBoundaryFiles_Test::TestBody
          (AddBoundaryInputsTest_TestOneBoundaryFiles_Test *this)

{
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *this_00;
  pointer *pppFVar1;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *this_01;
  iterator iVar2;
  size_t sVar3;
  FileMetaData *pFVar4;
  int line;
  char *message;
  FileMetaData *f1;
  AssertionResult gtest_ar;
  FileMetaData *f2;
  FileMetaData *f3;
  Message local_138;
  FileMetaData *local_130;
  ParsedInternalKey local_128;
  AssertHelper local_108;
  FileMetaData *local_100;
  FileMetaData *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_128.user_key.data_ = "100";
  local_128.user_key.size_ = 3;
  local_128.sequence = 3;
  local_128.type = kTypeValue;
  AppendInternalKey(&local_b0,&local_128);
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_128.user_key.data_ = "100";
  local_128.user_key.size_ = 3;
  local_128.sequence = 2;
  local_128.type = kTypeValue;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  AppendInternalKey(&local_50,&local_128);
  pFVar4 = AddBoundaryInputsTest::CreateFileMetaData
                     (&this->super_AddBoundaryInputsTest,1,(InternalKey *)&local_b0,
                      (InternalKey *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_128.user_key.data_ = "100";
  local_128.user_key.size_ = 3;
  local_128.sequence = 1;
  local_128.type = kTypeValue;
  local_130 = pFVar4;
  AppendInternalKey(&local_d0,&local_128);
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_128.user_key.data_ = "200";
  local_128.user_key.size_ = 3;
  local_128.sequence = 3;
  local_128.type = kTypeValue;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  AppendInternalKey(&local_70,&local_128);
  pFVar4 = AddBoundaryInputsTest::CreateFileMetaData
                     (&this->super_AddBoundaryInputsTest,1,(InternalKey *)&local_d0,
                      (InternalKey *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_128.user_key.data_ = "300";
  local_128.user_key.size_ = 3;
  local_128.sequence = 2;
  local_128.type = kTypeValue;
  local_100 = pFVar4;
  AppendInternalKey(&local_f0,&local_128);
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_128.user_key.data_ = "300";
  local_128.user_key.size_ = 3;
  local_128.sequence = 1;
  local_128.type = kTypeValue;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  AppendInternalKey(&local_90,&local_128);
  pFVar4 = AddBoundaryInputsTest::CreateFileMetaData
                     (&this->super_AddBoundaryInputsTest,1,(InternalKey *)&local_f0,
                      (InternalKey *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  this_00 = &(this->super_AddBoundaryInputsTest).level_files_;
  iVar2._M_current =
       (this->super_AddBoundaryInputsTest).level_files_.
       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_f8 = pFVar4;
  if (iVar2._M_current ==
      (this->super_AddBoundaryInputsTest).level_files_.
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
    _M_realloc_insert<leveldb::FileMetaData*const&>
              ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)this_00,
               iVar2,&local_f8);
  }
  else {
    *iVar2._M_current = pFVar4;
    pppFVar1 = &(this->super_AddBoundaryInputsTest).level_files_.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppFVar1 = *pppFVar1 + 1;
  }
  iVar2._M_current =
       (this->super_AddBoundaryInputsTest).level_files_.
       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->super_AddBoundaryInputsTest).level_files_.
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
    _M_realloc_insert<leveldb::FileMetaData*const&>
              ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)this_00,
               iVar2,&local_100);
  }
  else {
    *iVar2._M_current = local_100;
    pppFVar1 = &(this->super_AddBoundaryInputsTest).level_files_.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppFVar1 = *pppFVar1 + 1;
  }
  iVar2._M_current =
       (this->super_AddBoundaryInputsTest).level_files_.
       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->super_AddBoundaryInputsTest).level_files_.
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
    _M_realloc_insert<leveldb::FileMetaData*const&>
              ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)this_00,
               iVar2,&local_130);
  }
  else {
    *iVar2._M_current = local_130;
    pppFVar1 = &(this->super_AddBoundaryInputsTest).level_files_.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppFVar1 = *pppFVar1 + 1;
  }
  this_01 = &(this->super_AddBoundaryInputsTest).compaction_files_;
  iVar2._M_current =
       (this->super_AddBoundaryInputsTest).compaction_files_.
       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->super_AddBoundaryInputsTest).compaction_files_.
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
    _M_realloc_insert<leveldb::FileMetaData*const&>
              ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)this_01,
               iVar2,&local_130);
  }
  else {
    *iVar2._M_current = local_130;
    pppFVar1 = &(this->super_AddBoundaryInputsTest).compaction_files_.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppFVar1 = *pppFVar1 + 1;
  }
  AddBoundaryInputs(&(this->super_AddBoundaryInputsTest).icmp_,this_00,this_01);
  local_108.data_._0_4_ = 2;
  local_138.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )((long)(this->super_AddBoundaryInputsTest).compaction_files_.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->super_AddBoundaryInputsTest).compaction_files_.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_128,"2","compaction_files_.size()",(int *)&local_108,
             (unsigned_long *)&local_138);
  sVar3 = local_128.user_key.size_;
  if ((char)local_128.user_key.data_ == '\0') {
    testing::Message::Message(&local_138);
    if ((undefined8 *)local_128.user_key.size_ == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_128.user_key.size_;
    }
    line = 0x114;
  }
  else {
    if ((undefined8 *)local_128.user_key.size_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_128.user_key.size_ !=
          (undefined8 *)(local_128.user_key.size_ + 0x10)) {
        operator_delete(*(undefined8 **)local_128.user_key.size_);
      }
      operator_delete((void *)sVar3);
    }
    testing::internal::CmpHelperEQ<leveldb::FileMetaData*,leveldb::FileMetaData*>
              ((internal *)&local_128,"f1","compaction_files_[0]",&local_130,
               (this_01->
               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               )._M_impl.super__Vector_impl_data._M_start);
    sVar3 = local_128.user_key.size_;
    if ((char)local_128.user_key.data_ == '\0') {
      testing::Message::Message(&local_138);
      if ((undefined8 *)local_128.user_key.size_ == (undefined8 *)0x0) {
        message = "";
      }
      else {
        message = *(char **)local_128.user_key.size_;
      }
      line = 0x115;
    }
    else {
      if ((undefined8 *)local_128.user_key.size_ != (undefined8 *)0x0) {
        if (*(undefined8 **)local_128.user_key.size_ !=
            (undefined8 *)(local_128.user_key.size_ + 0x10)) {
          operator_delete(*(undefined8 **)local_128.user_key.size_);
        }
        operator_delete((void *)sVar3);
      }
      testing::internal::CmpHelperEQ<leveldb::FileMetaData*,leveldb::FileMetaData*>
                ((internal *)&local_128,"f2","compaction_files_[1]",&local_100,
                 (this_01->
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1);
      if ((char)local_128.user_key.data_ != '\0') goto LAB_00110ed7;
      testing::Message::Message(&local_138);
      if ((undefined8 *)local_128.user_key.size_ == (undefined8 *)0x0) {
        message = "";
      }
      else {
        message = *(char **)local_128.user_key.size_;
      }
      line = 0x116;
    }
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_108,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
             ,line,message);
  testing::internal::AssertHelper::operator=(&local_108,&local_138);
  testing::internal::AssertHelper::~AssertHelper(&local_108);
  if (local_138.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_138.ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
LAB_00110ed7:
  sVar3 = local_128.user_key.size_;
  if ((undefined8 *)local_128.user_key.size_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_128.user_key.size_ != (undefined8 *)(local_128.user_key.size_ + 0x10))
    {
      operator_delete(*(undefined8 **)local_128.user_key.size_);
    }
    operator_delete((void *)sVar3);
  }
  return;
}

Assistant:

TEST_F(AddBoundaryInputsTest, TestOneBoundaryFiles) {
  FileMetaData* f1 =
      CreateFileMetaData(1, InternalKey("100", 3, kTypeValue),
                         InternalKey(InternalKey("100", 2, kTypeValue)));
  FileMetaData* f2 =
      CreateFileMetaData(1, InternalKey("100", 1, kTypeValue),
                         InternalKey(InternalKey("200", 3, kTypeValue)));
  FileMetaData* f3 =
      CreateFileMetaData(1, InternalKey("300", 2, kTypeValue),
                         InternalKey(InternalKey("300", 1, kTypeValue)));

  level_files_.push_back(f3);
  level_files_.push_back(f2);
  level_files_.push_back(f1);
  compaction_files_.push_back(f1);

  AddBoundaryInputs(icmp_, level_files_, &compaction_files_);
  ASSERT_EQ(2, compaction_files_.size());
  ASSERT_EQ(f1, compaction_files_[0]);
  ASSERT_EQ(f2, compaction_files_[1]);
}